

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int xpath_derived_from(lyxp_set **args,uint16_t UNUSED_arg_count,lyd_node *cur_node,
                      lys_module *param_4,lyxp_set *set,int options)

{
  ly_ctx *plVar1;
  lyd_node *plVar2;
  int iVar3;
  lys_node *plVar4;
  char *pcVar5;
  uint local_54;
  int ret;
  lys_node_leaf *sleaf;
  lyd_node_leaf_list *leaf;
  uint16_t j;
  uint16_t i;
  int options_local;
  lyxp_set *set_local;
  lys_module *local_mod_local;
  lyd_node *cur_node_local;
  uint16_t UNUSED_arg_count_local;
  lyxp_set **args_local;
  
  if ((options & 0x1cU) == 0) {
    if (((*args)->type == LYXP_SET_NODE_SET) || ((*args)->type == LYXP_SET_EMPTY)) {
      iVar3 = lyxp_set_cast(args[1],LYXP_SET_STRING,cur_node,param_4,options);
      if (iVar3 == 0) {
        set_fill_boolean(set,0);
        if ((*args)->type != LYXP_SET_EMPTY) {
          for (leaf._2_2_ = 0; (uint)leaf._2_2_ < (*args)->used; leaf._2_2_ = leaf._2_2_ + 1) {
            plVar2 = ((*args)->val).nodes[leaf._2_2_].node;
            if (((plVar2->schema->nodetype & (LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN) &&
               (*(int *)&plVar2->schema[1].ref == 7)) {
              for (leaf._0_2_ = 0; (ushort)leaf < *(byte *)((long)&plVar2->child->next + 7);
                  leaf._0_2_ = (ushort)leaf + 1) {
                iVar3 = xpath_derived_from_ident_cmp
                                  (*(lys_ident **)
                                    (&plVar2->child->ht->used + (ulong)(ushort)leaf * 2),
                                   (args[1]->val).str);
                if (iVar3 == 0) {
                  set_fill_boolean(set,1);
                  break;
                }
              }
              if ((ushort)leaf < *(byte *)((long)&plVar2->child->next + 7)) break;
            }
          }
        }
        args_local._4_4_ = 0;
      }
      else {
        args_local._4_4_ = 0xffffffff;
      }
    }
    else {
      plVar1 = param_4->ctx;
      pcVar5 = print_set_type(*args);
      ly_vlog(plVar1,LYE_XPATH_INARGTYPE,LY_VLOG_NONE,(void *)0x0,1,pcVar5,
              "derived-from(node-set, string)");
      args_local._4_4_ = 0xffffffff;
    }
  }
  else {
    if (((*args)->type == LYXP_SET_SNODE_SET) &&
       (plVar4 = warn_get_snode_in_ctx(*args), plVar4 != (lys_node *)0x0)) {
      if ((plVar4->nodetype & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
        plVar1 = param_4->ctx;
        pcVar5 = strnodetype(plVar4->nodetype);
        ly_log(plVar1,LY_LLWRN,LY_SUCCESS,"Argument #1 of %s is a %s node \"%s\".",
               "xpath_derived_from",pcVar5,plVar4->name);
        local_54 = 1;
      }
      else {
        iVar3 = warn_is_specific_type((lys_type *)&plVar4[1].ref,LY_TYPE_IDENT);
        if (iVar3 == 0) {
          ly_log(param_4->ctx,LY_LLWRN,LY_SUCCESS,
                 "Argument #1 of %s is node \"%s\", not of type \"identityref\".",
                 "xpath_derived_from",plVar4->name);
        }
        local_54 = (uint)(iVar3 == 0);
      }
    }
    else {
      ly_log(param_4->ctx,LY_LLWRN,LY_SUCCESS,"Argument #1 of %s not a node-set as expected.",
             "xpath_derived_from");
      local_54 = 1;
    }
    if ((args[1]->type == LYXP_SET_SNODE_SET) &&
       (plVar4 = warn_get_snode_in_ctx(args[1]), plVar4 != (lys_node *)0x0)) {
      if ((plVar4->nodetype & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
        plVar1 = param_4->ctx;
        pcVar5 = strnodetype(plVar4->nodetype);
        ly_log(plVar1,LY_LLWRN,LY_SUCCESS,"Argument #2 of %s is a %s node \"%s\".",
               "xpath_derived_from",pcVar5,plVar4->name);
        local_54 = 1;
      }
      else {
        iVar3 = warn_is_string_type((lys_type *)&plVar4[1].ref);
        if (iVar3 == 0) {
          ly_log(param_4->ctx,LY_LLWRN,LY_SUCCESS,
                 "Argument #2 of %s is node \"%s\", not of string-type.","xpath_derived_from",
                 plVar4->name);
          local_54 = 1;
        }
      }
    }
    set_snode_clear_ctx(set);
    args_local._4_4_ = local_54;
  }
  return args_local._4_4_;
}

Assistant:

static int
xpath_derived_from(struct lyxp_set **args, uint16_t UNUSED(arg_count), struct lyd_node *cur_node, struct lys_module *local_mod,
                   struct lyxp_set *set, int options)
{
    uint16_t i, j;
    struct lyd_node_leaf_list *leaf;
    struct lys_node_leaf *sleaf;
    int ret = EXIT_SUCCESS;

    if (options & LYXP_SNODE_ALL) {
        if ((args[0]->type != LYXP_SET_SNODE_SET) || !(sleaf = (struct lys_node_leaf *)warn_get_snode_in_ctx(args[0]))) {
            LOGWRN(local_mod->ctx, "Argument #1 of %s not a node-set as expected.", __func__);
            ret = EXIT_FAILURE;
        } else if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
            LOGWRN(local_mod->ctx, "Argument #1 of %s is a %s node \"%s\".", __func__, strnodetype(sleaf->nodetype), sleaf->name);
            ret = EXIT_FAILURE;
        } else if (!warn_is_specific_type(&sleaf->type, LY_TYPE_IDENT)) {
            LOGWRN(local_mod->ctx, "Argument #1 of %s is node \"%s\", not of type \"identityref\".", __func__, sleaf->name);
            ret = EXIT_FAILURE;
        }

        if ((args[1]->type == LYXP_SET_SNODE_SET) && (sleaf = (struct lys_node_leaf *)warn_get_snode_in_ctx(args[1]))) {
            if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
                LOGWRN(local_mod->ctx, "Argument #2 of %s is a %s node \"%s\".", __func__, strnodetype(sleaf->nodetype), sleaf->name);
                ret = EXIT_FAILURE;
            } else if (!warn_is_string_type(&sleaf->type)) {
                LOGWRN(local_mod->ctx, "Argument #2 of %s is node \"%s\", not of string-type.", __func__, sleaf->name);
                ret = EXIT_FAILURE;
            }
        }
        set_snode_clear_ctx(set);
        return ret;
    }

    if ((args[0]->type != LYXP_SET_NODE_SET) && (args[0]->type != LYXP_SET_EMPTY)) {
        LOGVAL(local_mod->ctx, LYE_XPATH_INARGTYPE, LY_VLOG_NONE, NULL, 1, print_set_type(args[0]), "derived-from(node-set, string)");
        return -1;
    }
    if (lyxp_set_cast(args[1], LYXP_SET_STRING, cur_node, local_mod, options)) {
        return -1;
    }

    set_fill_boolean(set, 0);
    if (args[0]->type != LYXP_SET_EMPTY) {
        for (i = 0; i < args[0]->used; ++i) {
            leaf = (struct lyd_node_leaf_list *)args[0]->val.nodes[i].node;
            sleaf = (struct lys_node_leaf *)leaf->schema;
            if ((sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST)) && (sleaf->type.base == LY_TYPE_IDENT)) {
                for (j = 0; j < leaf->value.ident->base_size; ++j) {
                    if (!xpath_derived_from_ident_cmp(leaf->value.ident->base[j], args[1]->val.str)) {
                        set_fill_boolean(set, 1);
                        break;
                    }
                }

                if (j < leaf->value.ident->base_size) {
                    break;
                }
            }
        }
    }

    return EXIT_SUCCESS;
}